

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
write_int<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
           *this,int num_digits,string_view prefix,format_specs specs,bin_writer<3> f)

{
  uint uVar1;
  char cVar2;
  ulong uVar3;
  int iVar4;
  bool bVar5;
  format_specs local_60;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>::int_writer<long_long,_fmt::v6::basic_format_specs<char>_>::bin_writer<3>_>
  local_50;
  
  local_60._8_8_ = specs._8_8_;
  local_60._0_8_ = specs._0_8_;
  local_50.prefix.size_ = prefix.size_;
  local_50.prefix.data_ = prefix.data_;
  local_50.size_ = (uint)num_digits + local_50.prefix.size_;
  local_50.fill = specs.fill.data_[0];
  if ((specs._9_1_ & 0xf) == 4) {
    uVar3 = local_60._0_8_ & 0xffffffff;
    local_50.padding = 0;
    if (local_50.size_ <= uVar3) {
      local_50.padding = uVar3 - local_50.size_;
      local_50.size_ = uVar3;
    }
  }
  else {
    iVar4 = specs.precision;
    bVar5 = iVar4 - num_digits == 0;
    cVar2 = '0';
    if (bVar5 || iVar4 < num_digits) {
      cVar2 = local_50.fill;
    }
    local_50.fill = cVar2;
    uVar1 = iVar4 - num_digits;
    if (bVar5 || iVar4 < num_digits) {
      uVar1 = 0;
    }
    if (!bVar5 && num_digits <= iVar4) {
      local_50.size_ = ((ulong)local_60._0_8_ >> 0x20) + local_50.prefix.size_;
    }
    local_50.padding = (ulong)uVar1;
    if (((undefined1  [16])specs & (undefined1  [16])0xf00) == (undefined1  [16])0x0) {
      local_60._8_8_ = local_60._8_8_ | 0x200;
    }
  }
  local_50.f.abs_value = f.abs_value;
  local_50.f.num_digits = f.num_digits;
  local_50.f._12_4_ = f._12_4_;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<long_long,fmt::v6::basic_format_specs<char>>::bin_writer<3>>>
            (this,&local_60,&local_50);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }